

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_messenger.cpp
# Opt level: O0

void __thiscall
cppcms::impl::messenger::transmit(messenger *this,tcp_operation_header *h,string *data)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  mutable_buffer *in_RDX;
  long in_RSI;
  long in_RDI;
  error_code er;
  endpoint ep;
  system_error *e;
  vector<char,_std::allocator<char>_> d;
  const_buffer packet;
  int times;
  bool done;
  const_buffer *in_stack_fffffffffffffd98;
  const_buffer *in_stack_fffffffffffffda0;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  allocator_type *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  mutable_buffer *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __first;
  allocator<char> local_109;
  vector<char,_std::allocator<char>_> local_108 [9];
  undefined4 local_20;
  byte local_19;
  mutable_buffer *local_18;
  long local_10;
  
  local_19 = 0;
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    booster::aio::buffer(in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0);
    booster::aio::const_buffer::const_buffer
              ((const_buffer *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x47f9bf);
    if (*(int *)(local_10 + 4) != 0) {
      std::__cxx11::string::c_str();
      booster::aio::buffer(in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0);
      booster::aio::operator+=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      booster::aio::const_buffer::~const_buffer((const_buffer *)0x47fa21);
    }
    booster::aio::stream_socket::write((const_buffer *)(in_RDI + 8));
    booster::aio::buffer(in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0);
    booster::aio::stream_socket::read((mutable_buffer *)(in_RDI + 8));
    booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x47fb04);
    if (*(int *)(local_10 + 4) == 0) {
      std::__cxx11::string::clear();
    }
    else {
      __last._M_current = (char *)(ulong)*(uint *)(local_10 + 4);
      __first._M_current = (char *)&local_109;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::allocator<char>::~allocator(&local_109);
      in_stack_fffffffffffffdd0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
      booster::aio::buffer(in_stack_fffffffffffffda8);
      booster::aio::stream_socket::read((mutable_buffer *)in_stack_fffffffffffffdd0);
      booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x47fba4);
      in_stack_fffffffffffffdc0 = local_108;
      in_stack_fffffffffffffdc8 = local_18;
      std::vector<char,_std::allocator<char>_>::begin
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd98);
      std::vector<char,_std::allocator<char>_>::begin
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd98);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
                ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffffda8,(difference_type)in_stack_fffffffffffffda0);
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (in_stack_fffffffffffffdd0,__first,__last);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdb0);
    }
    local_19 = 1;
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x47fcde);
  } while (((local_19 ^ 0xff) & 1) != 0);
  return;
}

Assistant:

void messenger::transmit(tcp_operation_header &h,std::string &data)
{
	bool done=false;
	int times=0;
	do {
		try {
			booster::aio::const_buffer packet = booster::aio::buffer(&h,sizeof(h));
			if(h.size > 0)
				packet += booster::aio::buffer(data.c_str(),h.size);
				
			socket_.write(packet);
			socket_.read(booster::aio::buffer(&h,sizeof(h)));
			if(h.size>0) {
				std::vector<char> d(h.size);
				socket_.read(booster::aio::buffer(d));
				data.assign(d.begin(),d.begin()+h.size);
			}
			else {
				data.clear();
			}
			done=true;
		}
		catch(booster::system::system_error const &e) {
			if(times) {
				throw cppcms_error(std::string("tcp_cache:")+e.what());
			}
			socket_.close();
			booster::aio::endpoint ep(ip_,port_);
			booster::system::error_code er;
			socket_.open(ep.family(),er);
			if(!er)
				socket_.connect(ep,er);
			if(er) throw cppcms_error("reconnect:"+er.message());
			times++;
		}
	}while(!done);
}